

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilitySelector.hpp
# Opt level: O1

Status __thiscall
AO::BehaviorTree::Version_1::Details::ProbabilitySelector<Agent,_short>::execute
          (ProbabilitySelector<Agent,_short> *this,EntityPtr entity,short args)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  Status SVar3;
  __node_base *p_Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  peVar1 = (this->currentNode).
           super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    if (ProbabilitySelector<Agent,short>::execute(Agent*,short)::generator == '\0') {
      ProbabilitySelector<Agent,short>::execute();
    }
    fVar6 = this->totalSum;
    fVar5 = std::
            generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (&execute::generator);
    fVar7 = 0.0;
    fVar6 = fVar5 * fVar6 + 0.0;
    p_Var4 = &(this->weightingMap)._M_h._M_before_begin;
    iVar2 = (int)args;
    do {
      SVar3 = (Status)args;
      p_Var4 = p_Var4->_M_nxt;
      if (p_Var4 == (__node_base *)0x0) break;
      fVar7 = fVar7 + *(float *)(p_Var4 + 3);
      if (fVar6 <= fVar7) {
        args = (*(code *)(p_Var4[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var4[1]._M_nxt,entity,iVar2);
        if ((char)args == '\x02') {
          (this->currentNode).
          super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)p_Var4[1]._M_nxt;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(this->currentNode).
                      super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 2));
        }
      }
      SVar3 = (Status)args;
    } while (fVar7 < fVar6);
    if (p_Var4 == (__node_base *)0x0) {
      __assert_fail("!\"Weighting is too high\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herpec-j[P]BehaviorTree//BehaviorTree/Includes/BehaviorTree/Details/ProbabilitySelector.hpp"
                    ,0x54,
                    "virtual Status AO::BehaviorTree::Details::ProbabilitySelector<Agent, short>::execute(EntityPtr, Args...) [Entity = Agent, Args = <short>]"
                   );
    }
  }
  else {
    iVar2 = (*(peVar1->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                      (peVar1,entity,(ulong)(uint)(int)args);
    SVar3 = (Status)iVar2;
    if (SVar3 != Running) {
      this_00 = (this->currentNode).
                super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      (this->currentNode).
      super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (this->currentNode).
      super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  return SVar3;
}

Assistant:

Status execute(EntityPtr entity, Args... args) override final
					{
						if (currentNode)
						{
							Status const status = currentNode->execute(entity, args...);
							if (status != Status::Running)
							{
								currentNode.reset();
							}
							return status;
						}
						else
						{
							static std::default_random_engine generator(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
							std::uniform_real_distribution<float> distribution(0.0f, totalSum);
							float const chosen = distribution(generator);
							float sum = 0.0f;
							for (auto &weighting : weightingMap)
							{
								sum += weighting.second;
								if (sum >= chosen)
								{
									Status const status = weighting.first->execute(entity, args...);
									if (status == Status::Running)
									{
										currentNode = weighting.first;
									}
									return status;
								}
							}
							assert(!"Weighting is too high");
							return Status::Failure;
						}
					}